

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O2

uint64_t kmer_cannonical(uint64_t kmer,uint8_t k)

{
  uint64_t uVar1;
  
  uVar1 = kmer_reverse(kmer,k);
  if (kmer <= uVar1) {
    uVar1 = kmer;
  }
  return uVar1;
}

Assistant:

uint64_t kmer_cannonical(uint64_t kmer, uint8_t k) {
    uint64_t rkmer=kmer_reverse(kmer,k);
    return (rkmer<kmer ? rkmer:kmer);
}